

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCoberturaCoverage.cxx
# Opt level: O3

bool __thiscall
cmParseCoberturaCoverage::ReadCoverageXML(cmParseCoberturaCoverage *this,char *xmlFile)

{
  XMLParser parser;
  XMLParser local_88;
  
  XMLParser::XMLParser(&local_88,this->CTest,this->Coverage);
  cmXMLParser::ParseFile(&local_88.super_cmXMLParser,xmlFile);
  local_88.super_cmXMLParser._vptr_cmXMLParser = (_func_int **)&PTR__XMLParser_00b16b98;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.CurFileName._M_dataplus._M_p != &local_88.CurFileName.field_2) {
    operator_delete(local_88.CurFileName._M_dataplus._M_p,
                    local_88.CurFileName.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88.FilePaths);
  cmXMLParser::~cmXMLParser(&local_88.super_cmXMLParser);
  return true;
}

Assistant:

bool cmParseCoberturaCoverage::ReadCoverageXML(const char* xmlFile)
{
  cmParseCoberturaCoverage::XMLParser parser(this->CTest, this->Coverage);
  parser.ParseFile(xmlFile);
  return true;
}